

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

void icu_63::olsonToMetaInit(UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_ZONEMETA,zoneMeta_cleanup);
  gOlsonToMeta = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    uhash_setKeyDeleter_63(gOlsonToMeta,deleteUCharString);
    uhash_setValueDeleter_63(gOlsonToMeta,deleteUVector);
  }
  else {
    gOlsonToMeta = (UHashtable *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV olsonToMetaInit(UErrorCode &status) {
    U_ASSERT(gOlsonToMeta == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_ZONEMETA, zoneMeta_cleanup);
    gOlsonToMeta = uhash_open(uhash_hashUChars, uhash_compareUChars, NULL, &status);
    if (U_FAILURE(status)) {
        gOlsonToMeta = NULL;
    } else {
        uhash_setKeyDeleter(gOlsonToMeta, deleteUCharString);
        uhash_setValueDeleter(gOlsonToMeta, deleteUVector);
    }
}